

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shared_alloc.hpp
# Opt level: O1

promoted_t<int> Omega_h::get_sum<int>(Read<int> *a)

{
  Alloc *pAVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar3 = pAVar1->size;
  }
  else {
    uVar3 = (ulong)pAVar1 >> 3;
  }
  entering_parallel = 0;
  iVar2 = 0;
  if ((uVar3 >> 2 & 0xffffffff) != 0) {
    lVar4 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + *(int *)((long)(a->write_).shared_alloc_.direct_ptr + lVar4);
      lVar4 = lVar4 + 4;
    } while ((long)(int)(uVar3 >> 2) * 4 != lVar4);
  }
  return iVar2;
}

Assistant:

const noexcept {
#ifndef __CUDA_ARCH__
    if (!(reinterpret_cast<std::uintptr_t>(alloc) & IN_PARALLEL)) {
#if defined(__GNUC__) && (__GNUC__ >= 7) && (!defined(__clang__))
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wnull-dereference"
#endif
      return alloc->size;
#if defined(__GNUC__) && (__GNUC__ >= 7) && (!defined(__clang__))
#pragma GCC diagnostic pop
#endif
    }
#endif
    return reinterpret_cast<std::uintptr_t>(alloc) >> 3;
  }